

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units_decl.hpp
# Opt level: O0

int __thiscall units::detail::unit_data::rootHertzModifier(unit_data *this,int power)

{
  int local_24;
  int power_local;
  unit_data *this_local;
  
  if ((((((int)*this << 0x18) >> 0x1c) * power == 0) ||
      (((uint)*this >> 0x1e & 1 & (uint)*this >> 0x1d & 1) == 0)) || (power % 2 != 0)) {
    local_24 = 0;
  }
  else {
    local_24 = -9;
    if (((int)*this << 0x18) >> 0x1c < 0 || power < 0) {
      local_24 = 9;
    }
    local_24 = (power / 2) * local_24;
  }
  return local_24;
}

Assistant:

constexpr int rootHertzModifier(int power) const
        {
            return (second_ * power == 0 || ((e_flag_ & i_flag_) == 0U) ||
                    power % 2 != 0) ?
                0 :
                (power / 2) * ((second_ < 0) || (power < 0) ? 9 : -9);
        }